

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O1

cmCMakePath * __thiscall cmCMakePath::Append(cmCMakePath *this,path *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  path local_40;
  
  std::filesystem::__cxx11::path::operator/=(&this->Path,path);
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_60,&this->Path,(allocator<char> *)&local_40);
  std::filesystem::__cxx11::path::path(&local_40,&local_60,auto_format);
  if (&local_40 != &this->Path) {
    Append();
  }
  std::filesystem::__cxx11::path::~path(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

cmCMakePath& Append(const cm::filesystem::path& path)
  {
    this->Path /= path;
    // filesystem::path::append use preferred_separator ('\' on Windows)
    // so convert back to '/'
    this->Path = this->Path.generic_string();
    return *this;
  }